

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintToChar<char16_t>(char16_t value,iu_ostream *os)

{
  ostream *poVar1;
  undefined6 in_register_0000003a;
  char16_t str [2];
  char16_t local_3c [2];
  string local_38;
  
  if ((int)CONCAT62(in_register_0000003a,value) != 0) {
    if ((ushort)value < 0x20) {
      poVar1 = std::operator<<(os,"0x");
      ToHexString<char16_t>(&local_38,value);
      std::operator<<(poVar1,(string *)&local_38);
    }
    else {
      local_3c[1] = 0;
      local_3c[0] = value;
      poVar1 = std::operator<<(os,"\'");
      ShowAnyCString<char16_t>(&local_38,local_3c);
      poVar1 = std::operator<<(poVar1,(string *)&local_38);
      std::operator<<(poVar1,"\'");
    }
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  std::operator<<(os,"\\0");
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}